

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLin>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLogLin> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  float *pfVar1;
  double dVar2;
  ImVec2 IVar3;
  int iVar4;
  ImU32 IVar5;
  GetterXsYs<long_long> *pGVar6;
  TransformerLogLin *pTVar7;
  long lVar8;
  ImPlotPlot *pIVar9;
  ImDrawVert *pIVar10;
  uint *puVar11;
  ImPlotContext *pIVar12;
  long lVar13;
  bool bVar14;
  float fVar15;
  double dVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  pIVar12 = GImPlot;
  pGVar6 = this->Getter;
  pTVar7 = this->Transformer;
  iVar4 = pGVar6->Count;
  lVar13 = (long)(((pGVar6->Offset + prim + 1) % iVar4 + iVar4) % iVar4) * (long)pGVar6->Stride;
  lVar8 = *(long *)((long)pGVar6->Ys + lVar13);
  dVar16 = log10((double)*(long *)((long)pGVar6->Xs + lVar13) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar9 = pIVar12->CurrentPlot;
  dVar2 = (pIVar9->XAxis).Range.Min;
  iVar4 = pTVar7->YAxis;
  fVar19 = (float)((((double)(float)(dVar16 / pIVar12->LogDenX) *
                     ((pIVar9->XAxis).Range.Max - dVar2) + dVar2) - dVar2) * pIVar12->Mx +
                  (double)pIVar12->PixelRange[iVar4].Min.x);
  fVar20 = (float)(((double)lVar8 - pIVar9->YAxis[iVar4].Range.Min) * pIVar12->My[iVar4] +
                  (double)pIVar12->PixelRange[iVar4].Min.y);
  fVar18 = (this->P1).x;
  fVar21 = (this->P1).y;
  fVar17 = fVar21;
  if (fVar20 <= fVar21) {
    fVar17 = fVar20;
  }
  bVar14 = false;
  if ((fVar17 < (cull_rect->Max).y) &&
     (fVar17 = (float)(-(uint)(fVar20 <= fVar21) & (uint)fVar21 |
                      ~-(uint)(fVar20 <= fVar21) & (uint)fVar20), pfVar1 = &(cull_rect->Min).y,
     bVar14 = false, *pfVar1 <= fVar17 && fVar17 != *pfVar1)) {
    fVar17 = fVar18;
    if (fVar19 <= fVar18) {
      fVar17 = fVar19;
    }
    if (fVar17 < (cull_rect->Max).x) {
      fVar17 = (float)(~-(uint)(fVar19 <= fVar18) & (uint)fVar19 |
                      -(uint)(fVar19 <= fVar18) & (uint)fVar18);
      bVar14 = (cull_rect->Min).x <= fVar17 && fVar17 != (cull_rect->Min).x;
    }
  }
  if (bVar14 != false) {
    fVar17 = this->Weight;
    IVar5 = this->Col;
    IVar3 = *uv;
    fVar18 = fVar19 - fVar18;
    fVar21 = fVar20 - fVar21;
    fVar15 = fVar18 * fVar18 + fVar21 * fVar21;
    if (0.0 < fVar15) {
      if (fVar15 < 0.0) {
        fVar15 = sqrtf(fVar15);
      }
      else {
        fVar15 = SQRT(fVar15);
      }
      fVar18 = fVar18 * (1.0 / fVar15);
      fVar21 = fVar21 * (1.0 / fVar15);
    }
    fVar17 = fVar17 * 0.5;
    fVar18 = fVar18 * fVar17;
    fVar17 = fVar17 * fVar21;
    pIVar10 = DrawList->_VtxWritePtr;
    (pIVar10->pos).x = (this->P1).x + fVar17;
    (pIVar10->pos).y = (this->P1).y - fVar18;
    pIVar10->uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10->col = IVar5;
    pIVar10[1].pos.x = fVar17 + fVar19;
    pIVar10[1].pos.y = fVar20 - fVar18;
    pIVar10[1].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[1].col = IVar5;
    pIVar10[2].pos.x = fVar19 - fVar17;
    pIVar10[2].pos.y = fVar18 + fVar20;
    pIVar10[2].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[2].col = IVar5;
    pIVar10[3].pos.x = (this->P1).x - fVar17;
    pIVar10[3].pos.y = fVar18 + (this->P1).y;
    pIVar10[3].uv = IVar3;
    pIVar10 = DrawList->_VtxWritePtr;
    pIVar10[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar10 + 4;
    puVar11 = DrawList->_IdxWritePtr;
    *puVar11 = DrawList->_VtxCurrentIdx;
    puVar11[1] = DrawList->_VtxCurrentIdx + 1;
    puVar11[2] = DrawList->_VtxCurrentIdx + 2;
    puVar11[3] = DrawList->_VtxCurrentIdx;
    puVar11[4] = DrawList->_VtxCurrentIdx + 2;
    puVar11[5] = DrawList->_VtxCurrentIdx + 3;
    DrawList->_IdxWritePtr = puVar11 + 6;
    DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
  }
  IVar3.y = fVar20;
  IVar3.x = fVar19;
  this->P1 = IVar3;
  return bVar14;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }